

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::truncate
          (ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *this,char *__file,__off_t __length
          )

{
  char *pcVar1;
  Reader *target;
  size_t size_local;
  ArrayBuilder<capnp::schema::Node::SourceInfo::Reader> *this_local;
  
  pcVar1 = (char *)size(this);
  if (__file <= pcVar1) {
    this->pos = this->ptr + (long)__file;
    return (int)this;
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/array.h"
             ,0x1a3,"size <= this->size()","\"can\'t use truncate() to expand\"",
             "can\'t use truncate() to expand");
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }